

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuckoocache.h
# Opt level: O3

void __thiscall
CuckooCache::bit_packed_atomic_flags::bit_packed_atomic_flags
          (bit_packed_atomic_flags *this,uint32_t size)

{
  long lVar1;
  _Head_base<0UL,_std::atomic<unsigned_char>_*,_false> __s;
  uint32_t i;
  ulong uVar2;
  ulong __n;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  (this->mem)._M_t.
  super___uniq_ptr_impl<std::atomic<unsigned_char>,_std::default_delete<std::atomic<unsigned_char>[]>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::atomic<unsigned_char>_*,_std::default_delete<std::atomic<unsigned_char>[]>_>
  .super__Head_base<0UL,_std::atomic<unsigned_char>_*,_false>._M_head_impl =
       (atomic<unsigned_char> *)0x0;
  __n = (ulong)(size + 7 >> 3);
  __s._M_head_impl = (atomic<unsigned_char> *)operator_new__(__n);
  if (size + 7 < 8) {
    (this->mem)._M_t.
    super___uniq_ptr_impl<std::atomic<unsigned_char>,_std::default_delete<std::atomic<unsigned_char>[]>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::atomic<unsigned_char>_*,_std::default_delete<std::atomic<unsigned_char>[]>_>
    .super__Head_base<0UL,_std::atomic<unsigned_char>_*,_false>._M_head_impl = __s._M_head_impl;
  }
  else {
    uVar2 = 0;
    memset(__s._M_head_impl,0,__n);
    (this->mem)._M_t.
    super___uniq_ptr_impl<std::atomic<unsigned_char>,_std::default_delete<std::atomic<unsigned_char>[]>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::atomic<unsigned_char>_*,_std::default_delete<std::atomic<unsigned_char>[]>_>
    .super__Head_base<0UL,_std::atomic<unsigned_char>_*,_false>._M_head_impl = __s._M_head_impl;
    do {
      LOCK();
      (this->mem)._M_t.
      super___uniq_ptr_impl<std::atomic<unsigned_char>,_std::default_delete<std::atomic<unsigned_char>[]>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::atomic<unsigned_char>_*,_std::default_delete<std::atomic<unsigned_char>[]>_>
      .super__Head_base<0UL,_std::atomic<unsigned_char>_*,_false>._M_head_impl[uVar2].
      super___atomic_base<unsigned_char>._M_i = 0xff;
      UNLOCK();
      uVar2 = uVar2 + 1;
    } while (__n != uVar2);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

explicit bit_packed_atomic_flags(uint32_t size)
    {
        // pad out the size if needed
        size = (size + 7) / 8;
        mem.reset(new std::atomic<uint8_t>[size]);
        for (uint32_t i = 0; i < size; ++i)
            mem[i].store(0xFF);
    }